

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

int mctools_path_is_absolute(mcu8str *rawpath)

{
  char cVar1;
  mcu8str path;
  
  mctools_impl_view_no_winnamespace(&path,rawpath);
  if (path.size != 0) {
    if ((path.size != 1) && (*path.c_str == '~')) {
      if (path.c_str[1] == '/') {
        return 1;
      }
      if (path.c_str[1] == '\\') {
        return 1;
      }
    }
    cVar1 = mctools_drive_letter(&path);
    path.size = (uint)(path.c_str[(ulong)(cVar1 != '\0') * 2] == '\\' ||
                      path.c_str[(ulong)(cVar1 != '\0') * 2] == '/');
  }
  return path.size;
}

Assistant:

int mctools_path_is_absolute( const mcu8str* rawpath )
  {
    mcu8str path = mctools_impl_view_no_winnamespace(rawpath);
    if ( path.size == 0 )
      return 0;
    if ( path.size >= 2
         && path.c_str[0] == '~'
         && ( path.c_str[1] == '/' || path.c_str[1] == '\\' ) )
      return 1;//leading "~/"
    const char * path_begin = path.c_str;
    if ( mctools_drive_letter( &path ) )
      path_begin += 2;
    if ( *path_begin == '/' || *path_begin == '\\' )
      return 1;
    return 0;
  }